

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

Time __thiscall minibag::View::getBeginTime(View *this)

{
  bool bVar1;
  reference ppMVar2;
  pointer pIVar3;
  ulong uVar4;
  View *in_RDI;
  MessageRange *range;
  iterator __end1;
  iterator __begin1;
  vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_> *__range1;
  Time begin;
  MessageRange *in_stack_ffffffffffffffd0;
  __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
  local_20 [2];
  TimeBase<miniros::Time,_miniros::Duration> local_8;
  
  update(in_RDI);
  local_8 = miniros::TIME_MAX;
  local_20[0]._M_current =
       (MessageRange **)
       std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::begin
                 (&in_RDI->ranges_);
  std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>::end
            (&in_RDI->ranges_);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
                             *)in_RDI), bVar1) {
    ppMVar2 = __gnu_cxx::
              __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
              ::operator*(local_20);
    in_stack_ffffffffffffffd0 = *ppMVar2;
    pIVar3 = std::_Rb_tree_const_iterator<minibag::IndexEntry>::operator->
                       (&in_stack_ffffffffffffffd0->begin);
    uVar4 = miniros::TimeBase<miniros::Time,miniros::Duration>::operator<
                      ((TimeBase<miniros::Time,miniros::Duration> *)pIVar3,(Time *)&local_8);
    if ((uVar4 & 1) != 0) {
      pIVar3 = std::_Rb_tree_const_iterator<minibag::IndexEntry>::operator->
                         (&in_stack_ffffffffffffffd0->begin);
      local_8 = (pIVar3->time).super_TimeBase<miniros::Time,_miniros::Duration>;
    }
    __gnu_cxx::
    __normal_iterator<minibag::MessageRange_**,_std::vector<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>_>
    ::operator++(local_20);
  }
  return (Time)local_8;
}

Assistant:

miniros::Time View::getBeginTime()
{
  update();

  miniros::Time begin = miniros::TIME_MAX;

  for (minibag::MessageRange* range : ranges_)
  {
    if (range->begin->time < begin)
      begin = range->begin->time;
  }

  return begin;
}